

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O1

string * __thiscall
soul::CompileMessage::getFullDescription_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string local_60;
  string local_40;
  
  CodeLocation::getFilename_abi_cxx11_(&local_40,&this->location);
  if (local_40._M_string_length == 0) {
    getFullDescriptionWithoutFilename_abi_cxx11_(__return_storage_ptr__,this);
    goto LAB_001ce70c;
  }
  if ((this->location).location.data != (char *)0x0) {
    getPositionString_abi_cxx11_(&local_c0,this);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x2b0192);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_90 = *plVar4;
      lStack_88 = plVar2[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar4;
      local_a0 = (long *)*plVar2;
    }
    local_98 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_a0);
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  std::__cxx11::string::append((char *)&local_80);
  getSeverity_abi_cxx11_(&local_60,this);
  uVar6 = 0xf;
  if (local_80 != local_70) {
    uVar6 = local_70[0];
  }
  if (uVar6 < local_60._M_string_length + local_78) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar7 = local_60.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_60._M_string_length + local_78) goto LAB_001ce59a;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
  }
  else {
LAB_001ce59a:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_c0.field_2._M_allocated_capacity = *psVar5;
    local_c0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar5;
    local_c0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_c0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_90 = *plVar4;
    lStack_88 = plVar2[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*plVar2;
  }
  local_98 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(ulong)(this->description)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
LAB_001ce70c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getFullDescription() const
{
    auto filename = location.getFilename();

    if (filename.empty())
        return getFullDescriptionWithoutFilename();

    if (hasPosition())
        filename += ":" + getPositionString();

    return filename + ": " + getSeverity() + ": " + description;
}